

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_logging.c
# Opt level: O0

void oonf_log_cleanup(void)

{
  list_entity *__tempptr_3;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  oonf_log_handler_entry *poStack_18;
  oonf_log_source src;
  oonf_log_handler_entry *iterator;
  oonf_log_handler_entry *h;
  
  iterator = (oonf_log_handler_entry *)_handler_list.next;
  poStack_18 = (oonf_log_handler_entry *)(_handler_list.next)->next;
  while( true ) {
    if ((iterator->_node).prev == _handler_list.prev) break;
    oonf_log_removehandler(iterator);
    iterator = poStack_18;
    poStack_18 = (oonf_log_handler_entry *)(poStack_18->_node).next;
  }
  for (__tempptr._4_4_ = 6; __tempptr._4_4_ < 0x80; __tempptr._4_4_ = __tempptr._4_4_ + 1) {
    free(LOG_SOURCE_NAMES[__tempptr._4_4_]);
    LOG_SOURCE_NAMES[__tempptr._4_4_] = (char *)0x0;
  }
  abuf_free(&_logbuffer);
  return;
}

Assistant:

void
oonf_log_cleanup(void) {
  struct oonf_log_handler_entry *h, *iterator;
  enum oonf_log_source src;

  /* remove all handlers */
  list_for_each_element_safe(&_handler_list, h, _node, iterator) {
    oonf_log_removehandler(h);
  }

  for (src = LOG_CORESOURCE_COUNT; src < LOG_MAXIMUM_SOURCES; src++) {
    free((void *)LOG_SOURCE_NAMES[src]);
    LOG_SOURCE_NAMES[src] = NULL;
  }
  abuf_free(&_logbuffer);
}